

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void write_energy_deleted(ofstream *fout_energy_deleted)

{
  void *pvVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  double energy_ph_deleted;
  double energy_p_deleted;
  double energy_e_deleted;
  char local_39;
  double local_38;
  double local_30;
  double local_28;
  
  uVar3 = 0xffffffffffffffff;
  if (-1 < (long)n_ion_populations) {
    uVar3 = (long)n_ion_populations * 8;
  }
  pvVar1 = operator_new__(uVar3);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x108,&local_28,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x110,&local_30,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce((long)psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x118,&local_38,1,
             &ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  MPI_Reduce(*(undefined8 *)
              ((long)psr._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x120),pvVar1,
             n_ion_populations,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (mpi_rank == 0) {
    poVar2 = std::ostream::_M_insert<double>(local_28);
    local_39 = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
    poVar2 = std::ostream::_M_insert<double>(local_30);
    local_39 = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
    std::ostream::_M_insert<double>(local_38);
    if (0 < n_ion_populations) {
      lVar4 = 0;
      do {
        local_39 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)fout_energy_deleted,&local_39,1);
        std::ostream::_M_insert<double>(*(double *)((long)pvVar1 + lVar4 * 8));
        lVar4 = lVar4 + 1;
      } while (lVar4 < n_ion_populations);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)fout_energy_deleted + -0x18) +
                    (char)fout_energy_deleted);
    std::ostream::put((char)fout_energy_deleted);
    std::ostream::flush();
  }
  operator_delete__(pvVar1);
  return;
}

Assistant:

void write_energy_deleted(ofstream& fout_energy_deleted)
{
    double energy_e_deleted, energy_p_deleted, energy_ph_deleted;
    auto ienergy_deleted = unique_ptr<double[]>(new double[n_ion_populations]);
    MPI_Reduce(&(psr->energy_e_deleted), &energy_e_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->energy_p_deleted), &energy_p_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->energy_ph_deleted), &energy_ph_deleted, 1, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(psr->ienergy_deleted, ienergy_deleted.get(), n_ion_populations, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
    if (mpi_rank == 0) {
        fout_energy_deleted << energy_e_deleted << '\t' << energy_p_deleted << '\t' << energy_ph_deleted;
        for (int n=0; n<n_ion_populations; n++)
            fout_energy_deleted << '\t' << ienergy_deleted[n];
        fout_energy_deleted << endl;
    }
}